

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<int>::Visit
          (PrecomputeVisitor<int> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  undefined1 local_80 [24];
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  local_68;
  shared_ptr<const_calc4::UserDefinedOperator> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = op;
  (*(((op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ->super_Operator)._vptr_Operator[1])(local_80);
  for (p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._0_8_;
      p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_; p_Var1 = p_Var1 + 1)
  {
    Precompute((PrecomputeVisitor<int> *)&stack0xffffffffffffffc0,
               (shared_ptr<const_calc4::Operator> *)this);
    std::
    vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>
    ::emplace_back<std::shared_ptr<calc4::Operator_const>>
              ((vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>
                *)&local_68,(shared_ptr<const_calc4::Operator> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
             *)local_80);
  UserDefinedOperator::Create
            ((OperatorDefinition *)local_80,
             (vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
              *)&((local_48->
                  super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->definition,(_Optional_base<bool,_true,_true>)SUB82(&local_68,0));
  std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
             (__shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2> *)local_80)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        std::vector<std::shared_ptr<const Operator>> operands;

        for (auto& op2 : op->GetOperands())
        {
            operands.push_back(Precompute(op2));
        }

        value = UserDefinedOperator::Create(op->GetDefinition(), std::move(operands));
    }